

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

CopyablePtr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig>::operator=
          (CopyablePtr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig> *this,
          CopyablePtr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig> *other)

{
  TraceConfig_IncrementalStateConfig *this_00;
  CopyablePtr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig> *other_local;
  CopyablePtr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig,_std::default_delete<perfetto::protos::gen::TraceConfig_IncrementalStateConfig>_>
  ::operator=(&this->ptr_,&other->ptr_);
  this_00 = (TraceConfig_IncrementalStateConfig *)operator_new(0x38);
  perfetto::protos::gen::TraceConfig_IncrementalStateConfig::TraceConfig_IncrementalStateConfig
            (this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::TraceConfig_IncrementalStateConfig,_std::default_delete<perfetto::protos::gen::TraceConfig_IncrementalStateConfig>_>
  ::reset(&other->ptr_,this_00);
  return this;
}

Assistant:

CopyablePtr& operator=(CopyablePtr&& other) {
    ptr_ = std::move(other.ptr_);
    other.ptr_.reset(new T());
    return *this;
  }